

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ssls.c
# Opt level: O0

CURLcode tool_ssls_exp(CURL *easy,void *userptr,char *session_key,uchar *shmac,size_t shmac_len,
                      uchar *sdata,size_t sdata_len,curl_off_t valid_until,int ietf_tls_id,
                      char *alpn,size_t earlydata_max)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  CURLcode local_54;
  size_t sStack_50;
  CURLcode r;
  size_t enc_len;
  char *enc;
  tool_ssls_ctx *ctx;
  uchar *sdata_local;
  size_t shmac_len_local;
  uchar *shmac_local;
  char *session_key_local;
  void *userptr_local;
  CURL *easy_local;
  
  enc_len = 0;
  enc = (char *)userptr;
  ctx = (tool_ssls_ctx *)sdata;
  sdata_local = (uchar *)shmac_len;
  shmac_len_local = (size_t)shmac;
  shmac_local = (uchar *)session_key;
  session_key_local = (char *)userptr;
  userptr_local = easy;
  if (*(int *)((long)userptr + 0x10) == 0) {
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n# This file was generated by libcurl! Edit at your own risk.\n"
          ,*(FILE **)((long)userptr + 8));
  }
  local_54 = curlx_base64_encode((char *)shmac_len_local,(size_t)sdata_local,(char **)&enc_len,
                                 &stack0xffffffffffffffb0);
  sVar3 = sStack_50;
  if (local_54 == CURLE_OK) {
    local_54 = CURLE_WRITE_ERROR;
    sVar2 = fwrite((void *)enc_len,1,sStack_50,*(FILE **)(enc + 8));
    if ((sVar3 == sVar2) && (iVar1 = fputc(0x3a,*(FILE **)(enc + 8)), iVar1 != -1)) {
      curl_free(enc_len);
      local_54 = curlx_base64_encode((char *)ctx,sdata_len,(char **)&enc_len,
                                     &stack0xffffffffffffffb0);
      if (local_54 == CURLE_OK) {
        local_54 = CURLE_WRITE_ERROR;
        sVar3 = fwrite((void *)enc_len,1,sStack_50,*(FILE **)(enc + 8));
        if ((sStack_50 == sVar3) && (iVar1 = fputc(10,*(FILE **)(enc + 8)), iVar1 != -1)) {
          local_54 = CURLE_OK;
          *(int *)(enc + 0x10) = *(int *)(enc + 0x10) + 1;
        }
      }
    }
  }
  if (local_54 != CURLE_OK) {
    warnf(*(GlobalConfig **)enc,"Warning: error saving SSL session for \'%s\': %d",shmac_local,
          (ulong)local_54);
  }
  curl_free(enc_len);
  return local_54;
}

Assistant:

static CURLcode tool_ssls_exp(CURL *easy, void *userptr,
                              const char *session_key,
                              const unsigned char *shmac, size_t shmac_len,
                              const unsigned char *sdata, size_t sdata_len,
                              curl_off_t valid_until, int ietf_tls_id,
                              const char *alpn, size_t earlydata_max)
{
  struct tool_ssls_ctx *ctx = userptr;
  char *enc = NULL;
  size_t enc_len;
  CURLcode r;

  (void)easy;
  (void)valid_until;
  (void)ietf_tls_id;
  (void)alpn;
  (void)earlydata_max;
  if(!ctx->exported)
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n",
        ctx->fp);

  r = curlx_base64_encode((const char *)shmac, shmac_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc(':', ctx->fp))
    goto out;
  curl_free(enc);
  r = curlx_base64_encode((const char *)sdata, sdata_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc('\n', ctx->fp))
    goto out;
  r = CURLE_OK;
  ctx->exported++;
out:
  if(r)
    warnf(ctx->global, "Warning: error saving SSL session for '%s': %d",
          session_key, r);
  curl_free(enc);
  return r;
}